

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btLemkeAlgorithm.cpp
# Opt level: O1

void __thiscall
btLemkeAlgorithm::GaussJordanEliminationStep
          (btLemkeAlgorithm *this,btMatrixXf *A,int pivotRowIndex,int pivotColumnIndex,
          btAlignedObjectArray<int> *basis)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  uint uVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  float *pfVar10;
  int j;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  
  uVar5 = A->m_cols;
  iVar11 = uVar5 * pivotRowIndex;
  pfVar10 = (A->m_storage).m_data;
  fVar1 = pfVar10[iVar11 + pivotColumnIndex];
  iVar8 = A->m_rows;
  uVar6 = (ulong)iVar8;
  if (0 < (long)uVar6) {
    iVar7 = A->m_setElemOperations;
    uVar13 = 0;
    pfVar9 = pfVar10;
    do {
      if (uVar13 != (uint)pivotRowIndex && 0 < (int)uVar5) {
        uVar12 = 0;
        do {
          if ((uint)pivotColumnIndex != uVar12) {
            fVar2 = pfVar10[(long)iVar11 + uVar12];
            fVar3 = pfVar10[(long)pivotColumnIndex + uVar13 * (long)(int)uVar5];
            fVar4 = pfVar9[uVar12];
            iVar7 = iVar7 + 1;
            A->m_setElemOperations = iVar7;
            pfVar9[uVar12] = fVar2 * fVar3 * (-1.0 / fVar1) + fVar4;
          }
          uVar12 = uVar12 + 1;
        } while (uVar5 != uVar12);
      }
      uVar13 = uVar13 + 1;
      pfVar9 = pfVar9 + (int)uVar5;
    } while (uVar13 != uVar6);
  }
  if (0 < (int)uVar5) {
    iVar7 = A->m_setElemOperations;
    uVar13 = 0;
    do {
      pfVar10[(long)iVar11 + uVar13] = pfVar10[(long)iVar11 + uVar13] * -(-1.0 / fVar1);
      uVar13 = uVar13 + 1;
    } while (uVar5 != uVar13);
    A->m_setElemOperations = iVar7 + uVar5;
  }
  if (0 < iVar8) {
    iVar8 = A->m_setElemOperations;
    pfVar10 = pfVar10 + pivotColumnIndex;
    uVar13 = 0;
    do {
      if ((uint)pivotRowIndex != uVar13) {
        iVar8 = iVar8 + 1;
        A->m_setElemOperations = iVar8;
        *pfVar10 = 0.0;
      }
      uVar13 = uVar13 + 1;
      pfVar10 = pfVar10 + (int)uVar5;
    } while (uVar6 != uVar13);
  }
  return;
}

Assistant:

void btLemkeAlgorithm::GaussJordanEliminationStep(btMatrixXu& A, int pivotRowIndex, int pivotColumnIndex, const btAlignedObjectArray<int>& basis) 
{

	btScalar a = -1 / A(pivotRowIndex, pivotColumnIndex);
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif

    for (int i = 0; i < A.rows(); i++)
	{
      if (i != pivotRowIndex)
	  {
        for (int j = 0; j < A.cols(); j++)
		{
          if (j != pivotColumnIndex)
		  {
			  btScalar v = A(i, j);
			  v += A(pivotRowIndex, j) * A(i, pivotColumnIndex) * a;
            A.setElem(i, j, v);
		  }
		}
	  }
	}

#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //BT_DEBUG_OSTREAM
    for (int i = 0; i < A.cols(); i++) 
	{
      A.mulElem(pivotRowIndex, i,-a);
    }
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //#ifdef BT_DEBUG_OSTREAM

    for (int i = 0; i < A.rows(); i++)
	{
      if (i != pivotRowIndex)
	  {
        A.setElem(i, pivotColumnIndex,0);
	  }
	}
#ifdef BT_DEBUG_OSTREAM
	cout << A << std::endl;
#endif //#ifdef BT_DEBUG_OSTREAM
  }